

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.cc
# Opt level: O1

S2Point * S2::FaceXYZtoUVW(S2Point *__return_storage_ptr__,int face,S2Point *p)

{
  VType VVar1;
  VType VVar2;
  VType VVar3;
  
  switch(face) {
  case 0:
    VVar3 = p->c_[0];
    VVar1 = p->c_[1];
    VVar2 = p->c_[2];
    break;
  case 1:
    VVar1 = -p->c_[0];
    VVar2 = p->c_[2];
    VVar3 = p->c_[1];
    break;
  case 2:
    VVar1 = -p->c_[0];
    VVar2 = -p->c_[1];
    VVar3 = p->c_[2];
    break;
  case 3:
    VVar3 = p->c_[0];
    VVar1 = p->c_[2];
    VVar2 = -p->c_[1];
    goto LAB_001e92bf;
  case 4:
    VVar1 = p->c_[2];
    VVar2 = p->c_[0];
    VVar3 = p->c_[1];
LAB_001e92bf:
    VVar1 = -VVar1;
    VVar3 = -VVar3;
    break;
  default:
    VVar2 = p->c_[0];
    VVar1 = p->c_[1];
    VVar3 = -p->c_[2];
  }
  __return_storage_ptr__->c_[0] = VVar1;
  __return_storage_ptr__->c_[1] = VVar2;
  __return_storage_ptr__->c_[2] = VVar3;
  return __return_storage_ptr__;
}

Assistant:

S2Point FaceXYZtoUVW(int face, const S2Point& p) {
  // The result coordinates are simply the dot products of P with the (u,v,w)
  // axes for the given face (see kFaceUVWAxes).
  switch (face) {
    case 0:  return S2Point( p.y(),  p.z(),  p.x());
    case 1:  return S2Point(-p.x(),  p.z(),  p.y());
    case 2:  return S2Point(-p.x(), -p.y(),  p.z());
    case 3:  return S2Point(-p.z(), -p.y(), -p.x());
    case 4:  return S2Point(-p.z(),  p.x(), -p.y());
    default: return S2Point( p.y(),  p.x(), -p.z());
  }
}